

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_PrintfError_Test::TestBody(PrintfTest_PrintfError_Test *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  AssertHelper *this_00;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  char *in_stack_00000050;
  int result;
  file write_end;
  file read_end;
  buffered_file *this_01;
  file *this_02;
  int line;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  char (*in_stack_ffffffffffffffc8) [5];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd0;
  buffered_file local_28;
  type_conflict5 local_20;
  file local_10;
  buffered_file local_c;
  
  this_01 = &local_c;
  fmt::v5::file::file((file *)this_01);
  this_02 = &local_10;
  fmt::v5::file::file(this_02);
  fmt::v5::file::pipe((file *)this_01,&this_02->fd_);
  line = (int)((ulong)this_02 >> 0x20);
  fmt::v5::file::fdopen((file *)&local_28,(int)&local_c,"r");
  fmt::v5::buffered_file::get(&local_28);
  tVar2 = fmt::v5::fprintf<char[5]>
                    ((FILE *)in_stack_ffffffffffffffd0.ptr_,in_stack_ffffffffffffffc8);
  fmt::v5::buffered_file::~buffered_file(this_01);
  uVar3 = 0;
  local_20 = tVar2;
  testing::internal::CmpHelperLT<int,int>
            (_result,in_stack_00000050,(int *)gtest_ar.message_.ptr_,(int *)gtest_ar._0_8_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffc8);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x137cb5)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,line,(char *)this_01);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x137d03);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x137d43);
  fmt::v5::file::~file((file *)this_01);
  fmt::v5::file::~file((file *)this_01);
  return;
}

Assistant:

TEST(PrintfTest, PrintfError) {
  fmt::file read_end, write_end;
  fmt::file::pipe(read_end, write_end);
  int result = fmt::fprintf(read_end.fdopen("r").get(), "test");
  EXPECT_LT(result, 0);
}